

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImGui::RenderArrow(ImDrawList *draw_list,ImVec2 pos,ImU32 col,ImGuiDir dir,float scale)

{
  undefined1 auVar1 [16];
  undefined8 in_R9;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  
  fVar5 = pos.x;
  fVar6 = pos.y;
  fVar4 = draw_list->_Data->FontSize;
  if (dir + 1U < 6) {
    fVar9 = fVar4 * 0.4 * scale;
    switch(dir) {
    case 0:
      fVar9 = -fVar9;
    case 1:
      fVar7 = fVar9 * 0.75;
      fVar8 = fVar9 * 0.0;
      fVar2 = fVar9 * -0.75;
      fVar3 = fVar9 * 0.866;
      fVar9 = fVar9 * -0.866;
      fVar10 = fVar2;
      break;
    case 2:
      fVar9 = -fVar9;
    case 3:
      fVar7 = fVar9 * 0.0;
      fVar8 = fVar9 * 0.75;
      fVar2 = fVar9 * -0.866;
      fVar3 = fVar9 * -0.75;
      fVar10 = fVar9 * 0.866;
      fVar9 = fVar3;
      break;
    default:
      auVar1._8_4_ = in_XMM0_Dc;
      auVar1._0_8_ = pos;
      auVar1._12_4_ = in_XMM0_Dd;
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                  ,0xd3e,"RenderArrow","ImGui ASSERT FAILED: %s","0",in_R9,auVar1,scale);
      fVar5 = pos.x;
      fVar6 = pos.y;
      goto LAB_001d2c4c;
    }
  }
  else {
LAB_001d2c4c:
    fVar2 = 0.0;
    fVar3 = 0.0;
    fVar7 = 0.0;
    fVar8 = 0.0;
    fVar10 = 0.0;
    fVar9 = 0.0;
  }
  fVar4 = fVar4 * 0.5;
  fVar5 = fVar4 + fVar5;
  fVar6 = scale * fVar4 + fVar6;
  local_18.x = fVar7 + fVar5;
  local_18.y = fVar8 + fVar6;
  local_20.y = fVar3 + fVar6;
  local_20.x = fVar2 + fVar5;
  local_28.y = fVar6 + fVar9;
  local_28.x = fVar5 + fVar10;
  ImDrawList::AddTriangleFilled(draw_list,&local_18,&local_20,&local_28,col);
  return;
}

Assistant:

void ImGui::RenderArrow(ImDrawList* draw_list, ImVec2 pos, ImU32 col, ImGuiDir dir, float scale)
{
    const float h = draw_list->_Data->FontSize * 1.00f;
    float r = h * 0.40f * scale;
    ImVec2 center = pos + ImVec2(h * 0.50f, h * 0.50f * scale);

    ImVec2 a, b, c;
    switch (dir)
    {
    case ImGuiDir_Up:
    case ImGuiDir_Down:
        if (dir == ImGuiDir_Up) r = -r;
        a = ImVec2(+0.000f, +0.750f) * r;
        b = ImVec2(-0.866f, -0.750f) * r;
        c = ImVec2(+0.866f, -0.750f) * r;
        break;
    case ImGuiDir_Left:
    case ImGuiDir_Right:
        if (dir == ImGuiDir_Left) r = -r;
        a = ImVec2(+0.750f, +0.000f) * r;
        b = ImVec2(-0.750f, +0.866f) * r;
        c = ImVec2(-0.750f, -0.866f) * r;
        break;
    case ImGuiDir_None:
    case ImGuiDir_COUNT:
        IM_ASSERT(0);
        break;
    }
    draw_list->AddTriangleFilled(center + a, center + b, center + c, col);
}